

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O3

StringRef __thiscall
llvm::yaml::ScalarNode::unescapeDoubleQuoted
          (ScalarNode *this,StringRef UnquotedValue,size_type i,SmallVectorImpl<char> *Storage)

{
  byte bVar1;
  char *pcVar2;
  uint Radix;
  ulong uVar3;
  uint32_t uVar4;
  size_t sVar5;
  llvm *plVar6;
  SmallVectorImpl<char> *Result;
  bool bVar7;
  StringRef Chars;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef SVar8;
  unsigned_long_long ULLVal;
  StringRef local_98;
  uint32_t local_88;
  int iStack_84;
  iterator local_80;
  undefined8 local_78;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  ScalarNode *local_50;
  Twine local_48;
  
  uVar3 = UnquotedValue.Length;
  pcVar2 = UnquotedValue.Data;
  (Storage->super_SmallVectorTemplateBase<char,_true>).super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  Result = Storage;
  local_98.Data = pcVar2;
  local_98.Length = uVar3;
  if ((Storage->super_SmallVectorTemplateBase<char,_true>).
      super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Capacity < uVar3) {
    SmallVectorBase::grow_pod((SmallVectorBase *)Storage,Storage + 1,uVar3,1);
  }
  if (i != 0xffffffffffffffff) {
    local_50 = this;
    do {
      SmallVectorImpl<char>::insert<char_const*,void>
                (Storage,(iterator)
                         ((ulong)(Storage->super_SmallVectorTemplateBase<char,_true>).
                                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                                 Size +
                         (long)(Storage->super_SmallVectorTemplateBase<char,_true>).
                               super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                               BeginX),local_98.Data,local_98.Data + i);
      sVar5 = i;
      if (local_98.Length < i) {
        sVar5 = local_98.Length;
      }
      uVar3 = local_98.Length - sVar5;
      local_98.Data = local_98.Data + sVar5;
      if (local_98.Length <= i) {
        local_98.Length = uVar3;
        __assert_fail("!UnquotedValue.empty() && \"Can\'t be empty!\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/YAMLParser.cpp"
                      ,0x785,
                      "StringRef llvm::yaml::ScalarNode::unescapeDoubleQuoted(StringRef, StringRef::size_type, SmallVectorImpl<char> &) const"
                     );
      }
      if ((*local_98.Data == '\r') || (*local_98.Data == '\n')) {
        local_88 = CONCAT31(local_88._1_3_,10);
        local_98.Length = uVar3;
        SmallVectorTemplateBase<char,_true>::push_back
                  (&Storage->super_SmallVectorTemplateBase<char,_true>,(char *)&local_88);
        if ((1 < local_98.Length) && ((local_98.Data[1] == '\r' || (local_98.Data[1] == '\n')))) {
          local_98.Data = local_98.Data + 1;
          local_98.Length = local_98.Length - 1;
        }
        local_98.Data = local_98.Data + (local_98.Length != 0);
        local_98.Length = local_98.Length - (local_98.Length != 0);
        goto LAB_001ac09e;
      }
      local_98.Length = uVar3;
      if (uVar3 == 1) goto LAB_001ac09e;
      local_80 = local_98.Data + 1;
      local_98.Length = uVar3 - 1;
      bVar1 = local_98.Data[1];
      Radix = (uint)&local_88;
      if (bVar1 < 0x5c) {
        if (0x2e < bVar1) {
          switch(bVar1) {
          case 0x4c:
            uVar4 = 0x2028;
            break;
          case 0x4d:
          case 0x4f:
          case 0x51:
          case 0x52:
          case 0x53:
          case 0x54:
switchD_001ac0f5_caseD_5d:
            local_88 = 0;
            local_68 = 0;
            local_60 = 0;
            local_78 = 1;
            local_98.Data = local_80;
            local_70 = &local_60;
            Twine::Twine(&local_48,"Unrecognized escape code!");
            Scanner::setError(*(Scanner **)
                               &((((local_50->super_Node).Doc)->_M_t).
                                 super___uniq_ptr_impl<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_llvm::yaml::Document_*,_std::default_delete<llvm::yaml::Document>_>
                                 .super__Head_base<0UL,_llvm::yaml::Document_*,_false>._M_head_impl)
                                ->stream->scanner,&local_48,local_80);
            if (local_70 != &local_60) {
              operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
            }
            pcVar2 = "";
            uVar3 = 0;
            goto LAB_001ac36c;
          case 0x4e:
            uVar4 = 0x85;
            break;
          case 0x50:
            uVar4 = 0x2029;
            break;
          case 0x55:
            if (8 < local_98.Length) {
              plVar6 = (llvm *)(local_98.Data + 2);
              Str_01.Length = 0x10;
              Str_01.Data = (char *)0x8;
              local_98.Data = local_80;
              bVar7 = getAsUnsignedInteger(plVar6,Str_01,Radix,(unsigned_long_long *)Result);
              if ((bVar7) || (uVar4 = local_88, iStack_84 != 0)) {
                uVar4 = 0xfffd;
              }
              encodeUTF8(uVar4,Storage);
              bVar7 = local_98.Length < 8;
              uVar3 = 8;
              goto LAB_001ac2f5;
            }
            goto LAB_001ac32d;
          default:
            if (bVar1 == 0x2f) {
              local_88 = CONCAT31(local_88._1_3_,0x2f);
            }
            else {
              if (bVar1 != 0x30) goto switchD_001ac0f5_caseD_5d;
              local_88 = (uint)local_88._1_3_ << 8;
            }
            goto LAB_001ac322;
          }
LAB_001ac313:
          local_98.Data = local_80;
          encodeUTF8(uVar4,Storage);
          local_80 = local_98.Data;
          goto LAB_001ac32d;
        }
        if (bVar1 < 0xd) {
          if (bVar1 == 9) goto switchD_001ac0f5_caseD_74;
          if (bVar1 != 10) goto switchD_001ac0f5_caseD_5d;
        }
        else if (bVar1 != 0xd) {
          if (bVar1 == 0x20) {
            local_88 = CONCAT31(local_88._1_3_,0x20);
          }
          else {
            if (bVar1 != 0x22) goto switchD_001ac0f5_caseD_5d;
            local_88 = CONCAT31(local_88._1_3_,0x22);
          }
          goto LAB_001ac322;
        }
        if ((1 < local_98.Length) && ((local_98.Data[2] == '\r' || (local_98.Data[2] == '\n')))) {
          local_98.Length = uVar3 - 2;
          local_80 = local_98.Data + 2;
        }
      }
      else {
        switch(bVar1) {
        case 0x5c:
          local_88 = CONCAT31(local_88._1_3_,0x5c);
          break;
        default:
          goto switchD_001ac0f5_caseD_5d;
        case 0x5f:
          uVar4 = 0xa0;
          goto LAB_001ac313;
        case 0x61:
          local_88 = CONCAT31(local_88._1_3_,7);
          break;
        case 0x62:
          local_88 = CONCAT31(local_88._1_3_,8);
          break;
        case 0x65:
          local_88 = CONCAT31(local_88._1_3_,0x1b);
          break;
        case 0x66:
          local_88 = CONCAT31(local_88._1_3_,0xc);
          break;
        case 0x6e:
          local_88 = CONCAT31(local_88._1_3_,10);
          break;
        case 0x72:
          local_88 = CONCAT31(local_88._1_3_,0xd);
          break;
        case 0x74:
switchD_001ac0f5_caseD_74:
          local_88 = CONCAT31(local_88._1_3_,9);
          break;
        case 0x75:
          if (4 < local_98.Length) {
            plVar6 = (llvm *)(local_98.Data + 2);
            Str.Length = 0x10;
            Str.Data = (char *)0x4;
            local_98.Data = local_80;
            bVar7 = getAsUnsignedInteger(plVar6,Str,Radix,(unsigned_long_long *)Result);
            if ((bVar7) || (uVar4 = local_88, iStack_84 != 0)) {
              uVar4 = 0xfffd;
            }
            encodeUTF8(uVar4,Storage);
            bVar7 = local_98.Length < 4;
            uVar3 = 4;
LAB_001ac2f5:
            if (bVar7) {
              uVar3 = local_98.Length;
            }
            local_98.Length = local_98.Length - uVar3;
            local_80 = local_98.Data + uVar3;
          }
          goto LAB_001ac32d;
        case 0x76:
          local_88 = CONCAT31(local_88._1_3_,0xb);
          break;
        case 0x78:
          if (2 < local_98.Length) {
            plVar6 = (llvm *)(local_98.Data + 2);
            Str_00.Length = 0x10;
            Str_00.Data = (char *)0x2;
            local_98.Data = local_80;
            bVar7 = getAsUnsignedInteger(plVar6,Str_00,Radix,(unsigned_long_long *)Result);
            if ((bVar7) || (uVar4 = local_88, iStack_84 != 0)) {
              uVar4 = 0xfffd;
            }
            encodeUTF8(uVar4,Storage);
            bVar7 = local_98.Length < 2;
            uVar3 = 2;
            goto LAB_001ac2f5;
          }
          goto LAB_001ac32d;
        }
LAB_001ac322:
        local_98.Data = local_80;
        SmallVectorTemplateBase<char,_true>::push_back
                  (&Storage->super_SmallVectorTemplateBase<char,_true>,(char *)&local_88);
        local_80 = local_98.Data;
      }
LAB_001ac32d:
      local_98.Data = local_80;
      bVar7 = local_98.Length != 0;
      local_98.Length = local_98.Length - bVar7;
      local_98.Data = local_98.Data + bVar7;
LAB_001ac09e:
      Chars.Length = 3;
      Chars.Data = "\\\r\n";
      i = StringRef::find_first_of(&local_98,Chars,0);
      pcVar2 = local_98.Data;
      uVar3 = local_98.Length;
    } while (i != 0xffffffffffffffff);
  }
  SmallVectorImpl<char>::insert<char_const*,void>
            (Storage,(iterator)
                     ((ulong)(Storage->super_SmallVectorTemplateBase<char,_true>).
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size
                     + (long)(Storage->super_SmallVectorTemplateBase<char,_true>).
                             super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.
                             BeginX),pcVar2,pcVar2 + uVar3);
  pcVar2 = (char *)(Storage->super_SmallVectorTemplateBase<char,_true>).
                   super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  uVar3 = (ulong)(Storage->super_SmallVectorTemplateBase<char,_true>).
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
LAB_001ac36c:
  SVar8.Length = uVar3;
  SVar8.Data = pcVar2;
  return SVar8;
}

Assistant:

StringRef ScalarNode::unescapeDoubleQuoted( StringRef UnquotedValue
                                          , StringRef::size_type i
                                          , SmallVectorImpl<char> &Storage)
                                          const {
  // Use Storage to build proper value.
  Storage.clear();
  Storage.reserve(UnquotedValue.size());
  for (; i != StringRef::npos; i = UnquotedValue.find_first_of("\\\r\n")) {
    // Insert all previous chars into Storage.
    StringRef Valid(UnquotedValue.begin(), i);
    Storage.insert(Storage.end(), Valid.begin(), Valid.end());
    // Chop off inserted chars.
    UnquotedValue = UnquotedValue.substr(i);

    assert(!UnquotedValue.empty() && "Can't be empty!");

    // Parse escape or line break.
    switch (UnquotedValue[0]) {
    case '\r':
    case '\n':
      Storage.push_back('\n');
      if (   UnquotedValue.size() > 1
          && (UnquotedValue[1] == '\r' || UnquotedValue[1] == '\n'))
        UnquotedValue = UnquotedValue.substr(1);
      UnquotedValue = UnquotedValue.substr(1);
      break;
    default:
      if (UnquotedValue.size() == 1)
        // TODO: Report error.
        break;
      UnquotedValue = UnquotedValue.substr(1);
      switch (UnquotedValue[0]) {
      default: {
          Token T;
          T.Range = StringRef(UnquotedValue.begin(), 1);
          setError("Unrecognized escape code!", T);
          return "";
        }
      case '\r':
      case '\n':
        // Remove the new line.
        if (   UnquotedValue.size() > 1
            && (UnquotedValue[1] == '\r' || UnquotedValue[1] == '\n'))
          UnquotedValue = UnquotedValue.substr(1);
        // If this was just a single byte newline, it will get skipped
        // below.
        break;
      case '0':
        Storage.push_back(0x00);
        break;
      case 'a':
        Storage.push_back(0x07);
        break;
      case 'b':
        Storage.push_back(0x08);
        break;
      case 't':
      case 0x09:
        Storage.push_back(0x09);
        break;
      case 'n':
        Storage.push_back(0x0A);
        break;
      case 'v':
        Storage.push_back(0x0B);
        break;
      case 'f':
        Storage.push_back(0x0C);
        break;
      case 'r':
        Storage.push_back(0x0D);
        break;
      case 'e':
        Storage.push_back(0x1B);
        break;
      case ' ':
        Storage.push_back(0x20);
        break;
      case '"':
        Storage.push_back(0x22);
        break;
      case '/':
        Storage.push_back(0x2F);
        break;
      case '\\':
        Storage.push_back(0x5C);
        break;
      case 'N':
        encodeUTF8(0x85, Storage);
        break;
      case '_':
        encodeUTF8(0xA0, Storage);
        break;
      case 'L':
        encodeUTF8(0x2028, Storage);
        break;
      case 'P':
        encodeUTF8(0x2029, Storage);
        break;
      case 'x': {
          if (UnquotedValue.size() < 3)
            // TODO: Report error.
            break;
          unsigned int UnicodeScalarValue;
          if (UnquotedValue.substr(1, 2).getAsInteger(16, UnicodeScalarValue))
            // TODO: Report error.
            UnicodeScalarValue = 0xFFFD;
          encodeUTF8(UnicodeScalarValue, Storage);
          UnquotedValue = UnquotedValue.substr(2);
          break;
        }
      case 'u': {
          if (UnquotedValue.size() < 5)
            // TODO: Report error.
            break;
          unsigned int UnicodeScalarValue;
          if (UnquotedValue.substr(1, 4).getAsInteger(16, UnicodeScalarValue))
            // TODO: Report error.
            UnicodeScalarValue = 0xFFFD;
          encodeUTF8(UnicodeScalarValue, Storage);
          UnquotedValue = UnquotedValue.substr(4);
          break;
        }
      case 'U': {
          if (UnquotedValue.size() < 9)
            // TODO: Report error.
            break;
          unsigned int UnicodeScalarValue;
          if (UnquotedValue.substr(1, 8).getAsInteger(16, UnicodeScalarValue))
            // TODO: Report error.
            UnicodeScalarValue = 0xFFFD;
          encodeUTF8(UnicodeScalarValue, Storage);
          UnquotedValue = UnquotedValue.substr(8);
          break;
        }
      }
      UnquotedValue = UnquotedValue.substr(1);
    }
  }
  Storage.insert(Storage.end(), UnquotedValue.begin(), UnquotedValue.end());
  return StringRef(Storage.begin(), Storage.size());
}